

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall Am_Instance_Iterator::Next(Am_Instance_Iterator *this)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data *pAVar3;
  Am_Object_Data *pAVar4;
  
  pAVar4 = (this->current).data;
  if ((pAVar4 == (Am_Object_Data *)0x0) || ((pAVar4->data).data == (char *)0x0)) {
    pAVar4 = (this->prototype).data;
    if (pAVar4 == (Am_Object_Data *)0x0) {
      return;
    }
    if ((pAVar4->data).data == (char *)0x0) {
      return;
    }
    if (pAVar4 != (Am_Object_Data *)0x0) {
      puVar1 = &(pAVar4->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
    }
    pAVar3 = Am_Object_Data::Narrow(&pAVar4->super_Am_Wrapper);
    pAVar4 = pAVar3->first_instance;
  }
  else {
    if (pAVar4 != (Am_Object_Data *)0x0) {
      puVar1 = &(pAVar4->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
    }
    pAVar3 = Am_Object_Data::Narrow(&pAVar4->super_Am_Wrapper);
    pAVar4 = pAVar3->next_instance;
  }
  if (pAVar4 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar4->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar2 = (this->current).data;
  if (pAVar2 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  (this->current).data = pAVar4;
  puVar1 = &(pAVar3->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  (*(pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar3);
  return;
}

Assistant:

void
Am_Instance_Iterator::Next()
{
  if (current.Valid()) {
    Am_Object_Data *curr_data = Am_Object_Data::Narrow(current);
    if (curr_data->next_instance)
      curr_data->next_instance->Note_Reference();
    current = curr_data->next_instance;
    curr_data->Release();
  } else if (prototype.Valid()) {
    Am_Object_Data *proto_data = Am_Object_Data::Narrow(prototype);
    if (proto_data->first_instance)
      proto_data->first_instance->Note_Reference();
    current = proto_data->first_instance;
    proto_data->Release();
  }
}